

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int tremove(lua_State *L)

{
  StkId pTVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  int n;
  int iVar5;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  n = (int)sVar2;
  uVar3 = luaL_optinteger(L,2,(long)n);
  iVar5 = (int)uVar3;
  iVar4 = 0;
  if (iVar5 <= n && 0 < iVar5) {
    iVar4 = 1;
    lua_rawgeti(L,1,iVar5);
    while (iVar5 = (int)uVar3, n != iVar5) {
      lua_rawgeti(L,1,iVar5 + 1U);
      lua_rawseti(L,1,iVar5);
      uVar3 = (ulong)(iVar5 + 1U);
    }
    pTVar1 = L->top;
    pTVar1->tt = 0;
    L->top = pTVar1 + 1;
    lua_rawseti(L,1,n);
  }
  return iVar4;
}

Assistant:

static int tremove(lua_State*L){
int e=aux_getn(L,1);
int pos=luaL_optint(L,2,e);
if(!(1<=pos&&pos<=e))
return 0;
luaL_setn(L,1,e-1);
lua_rawgeti(L,1,pos);
for(;pos<e;pos++){
lua_rawgeti(L,1,pos+1);
lua_rawseti(L,1,pos);
}
lua_pushnil(L);
lua_rawseti(L,1,e);
return 1;
}